

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_bv_base.cpp
# Opt level: O0

void __thiscall sc_dt::sc_bv_base::assign_from_string(sc_bv_base *this,string *s)

{
  int iVar1;
  char *pcVar2;
  ulong in_RSI;
  sc_bv_base *in_RDI;
  sc_logic_value_t fill;
  char c;
  int i;
  int min_len;
  int s_len;
  int len;
  int in_stack_00000044;
  char *in_stack_00000048;
  char *in_stack_00000050;
  char *in_stack_00000058;
  sc_severity in_stack_00000064;
  int local_34;
  char local_21;
  int local_20;
  int local_18;
  int local_14;
  ulong local_10;
  
  local_14 = in_RDI->m_len;
  local_10 = in_RSI;
  local_18 = std::__cxx11::string::length();
  local_18 = local_18 + -1;
  iVar1 = sc_min<int>(&local_14,&local_18);
  for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
    local_21 = *pcVar2;
    if ((local_21 != '0') && (local_21 != '1')) {
      sc_core::sc_report_handler::report
                (in_stack_00000064,in_stack_00000058,in_stack_00000050,in_stack_00000048,
                 in_stack_00000044);
      local_21 = '0';
    }
    set_bit(in_RDI,local_20,local_21 != '0');
  }
  pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
  if (*pcVar2 == 'F') {
    pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
    local_34 = *pcVar2 + -0x30;
  }
  else {
    local_34 = 0;
  }
  for (; local_20 < local_14; local_20 = local_20 + 1) {
    set_bit(in_RDI,local_20,local_34 != 0);
  }
  return;
}

Assistant:

void
sc_bv_base::assign_from_string( const std::string& s )
{
    // s must have been converted to bin
    int len = m_len;
    int s_len = s.length() - 1;
    int min_len = sc_min( len, s_len );
    int i = 0;
    for( ; i < min_len; ++ i ) {
        char c = s[s_len - i - 1];
        if( c != '0' && c != '1' ) {
            SC_REPORT_ERROR( sc_core::SC_ID_CANNOT_CONVERT_,
                "string can contain only '0' and '1' characters" );
            // may continue, if suppressed
            c = '0';
        }
        set_bit( i, sc_logic_value_t( c - '0' ) );
    }
    // if formatted, fill the rest with sign(s), otherwise fill with zeros
    sc_logic_value_t fill = (s[s_len] == 'F' ? sc_logic_value_t( s[0] - '0' )
                                             : sc_logic_value_t( 0 ));
    for( ; i < len; ++ i ) {
        set_bit( i, fill );
    }
}